

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxCaseStatement::Resolve(FxCaseStatement *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PString *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxIntCast *this_00;
  FxExpression *pFVar4;
  FString local_30;
  int local_24;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Condition == (FxExpression *)0x0) {
    return &this->super_FxExpression;
  }
  iVar3 = (*this->Condition->_vptr_FxExpression[2])();
  pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
  this->Condition = pFVar4;
  if (pFVar4 != (FxExpression *)0x0) {
    iVar3 = (*pFVar4->_vptr_FxExpression[3])(pFVar4);
    if ((char)iVar3 != '\0') {
      pFVar4 = this->Condition;
      if (pFVar4->ValueType == (PType *)TypeName) {
        pPVar2 = (PString *)pFVar4[1]._vptr_FxExpression;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&pFVar4[1].ScriptPosition.FileName);
        }
        else {
          local_30.Chars = pFVar4[1].ScriptPosition.FileName.Chars;
        }
        ExpVal::GetName((ExpVal *)&local_24);
        this->CaseValue = local_24;
        if (pPVar2 != TypeString) {
          return &this->super_FxExpression;
        }
      }
      else {
        this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar4 = this->Condition;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,&pFVar4->ScriptPosition);
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_IntCast;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070b5b0;
        this_00->basex = pFVar4;
        (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
        this_00->NoWarn = false;
        this_00->Explicit = false;
        this->Condition = (FxExpression *)this_00;
        pFVar4 = FxIntCast::Resolve(this_00,ctx);
        this->Condition = pFVar4;
        if (pFVar4 == (FxExpression *)0x0) goto LAB_00537068;
        pPVar2 = (PString *)pFVar4[1]._vptr_FxExpression;
        if (pPVar2 == TypeString) {
          FString::AttachToOther(&local_30,&pFVar4[1].ScriptPosition.FileName);
        }
        else {
          local_30.Chars = pFVar4[1].ScriptPosition.FileName.Chars;
        }
        BVar1 = (pPVar2->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          iVar3 = (int)(double)local_30.Chars;
        }
        else {
          iVar3 = 0;
          if (BVar1 == '\0') {
            iVar3 = (int)local_30.Chars;
          }
        }
        this->CaseValue = iVar3;
        if (pPVar2 != TypeString) {
          return &this->super_FxExpression;
        }
      }
      FString::~FString(&local_30);
      return &this->super_FxExpression;
    }
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Case label must be a constant value");
  }
LAB_00537068:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxCaseStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE_OPT(Condition, ctx);

	if (Condition != nullptr)
	{
		if (!Condition->isConstant())
		{
			ScriptPosition.Message(MSG_ERROR, "Case label must be a constant value");
			delete this;
			return nullptr;
		}
		// Case labels can be ints or names.
		if (Condition->ValueType != TypeName)
		{
			Condition = new FxIntCast(Condition, false);
			SAFE_RESOLVE(Condition, ctx);
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetInt();
		}
		else
		{
			CaseValue = static_cast<FxConstant *>(Condition)->GetValue().GetName();
		}
	}
	return this;
}